

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receive.cpp
# Opt level: O0

CAmount wallet::CachedTxGetCredit(CWallet *wallet,CWalletTx *wtx,isminefilter *filter)

{
  bool bVar1;
  CAmount CVar2;
  uint *in_RDX;
  long in_FS_OFFSET;
  CWalletTx *unaff_retaddr;
  CWallet *in_stack_00000008;
  CAmount credit;
  isminefilter get_amount_filter;
  int in_stack_ffffffffffffffbc;
  CWalletTx *in_stack_ffffffffffffffc0;
  CWallet *in_stack_ffffffffffffffc8;
  long local_18;
  undefined4 in_stack_fffffffffffffff0;
  long lVar3;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffbc,(AnnotatedMixin<std::recursive_mutex> *)0x395009);
  bVar1 = CWallet::IsTxImmatureCoinBase(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  if (bVar1) {
    local_18 = 0;
  }
  else {
    local_18 = 0;
    if ((*in_RDX & 3) != 0) {
      CVar2 = GetCachableAmount(in_stack_00000008,unaff_retaddr,(AmountType)((ulong)lVar3 >> 0x20),
                                (isminefilter *)
                                (CONCAT44(*in_RDX,in_stack_fffffffffffffff0) & 0x3ffffffff));
      local_18 = CVar2 + local_18;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  return local_18;
}

Assistant:

CAmount CachedTxGetCredit(const CWallet& wallet, const CWalletTx& wtx, const isminefilter& filter)
{
    AssertLockHeld(wallet.cs_wallet);

    // Must wait until coinbase is safely deep enough in the chain before valuing it
    if (wallet.IsTxImmatureCoinBase(wtx))
        return 0;

    CAmount credit = 0;
    const isminefilter get_amount_filter{filter & ISMINE_ALL};
    if (get_amount_filter) {
        // GetBalance can assume transactions in mapWallet won't change
        credit += GetCachableAmount(wallet, wtx, CWalletTx::CREDIT, get_amount_filter);
    }
    return credit;
}